

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::avx::SphereMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  float fVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong uVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar38 [32];
  float fVar49;
  float fVar50;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar51 [36];
  float fVar52;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float fVar62;
  undefined1 auVar55 [64];
  undefined1 auVar63 [36];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar80 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [28];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar81 [64];
  undefined1 auVar83 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [28];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [28];
  undefined1 auVar89 [64];
  float fVar90;
  undefined1 auVar91 [28];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [64];
  undefined1 auVar96 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  int local_2c4;
  RayQueryContext *local_2c0;
  Scene *local_2b8;
  Primitive *local_2b0;
  float local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  uint local_298;
  undefined8 local_294;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_280;
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar75 [64];
  
  pSVar19 = context->scene;
  uVar27 = sphere->sharedGeomID;
  uVar29 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar2 = (pSVar19->geometries).items[uVar27].ptr;
  fVar1 = (pGVar2->time_range).lower;
  fVar1 = pGVar2->fnumTimeSegments *
          (((ray->dir).field_0.m128[3] - fVar1) / ((pGVar2->time_range).upper - fVar1));
  auVar32 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar32 = vminss_avx(auVar32,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
  auVar32 = vmaxss_avx(ZEXT816(0) << 0x20,auVar32);
  lVar3 = *(long *)&pGVar2[2].numPrimitives;
  lVar22 = (long)(int)auVar32._0_4_ * 0x38;
  lVar4 = *(long *)(lVar3 + lVar22);
  lVar5 = *(long *)(lVar3 + 0x10 + lVar22);
  uVar23 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar21 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar21);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar29);
  uVar24 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar53._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar24);
  auVar53._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar23);
  uVar31 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar26 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar20 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar20);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar31);
  uVar28 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar28);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
  lVar4 = *(long *)(lVar3 + 0x38 + lVar22);
  lVar3 = *(long *)(lVar3 + 0x48 + lVar22);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar21 * lVar3);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar29 * lVar3);
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar24 * lVar3);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar23 * lVar3);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar20 * lVar3);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar31 * lVar3);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar3 * uVar28);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar26 * lVar3);
  fVar1 = fVar1 - auVar32._0_4_;
  auVar33 = vunpcklps_avx(auVar45,auVar64);
  auVar69 = vunpckhps_avx(auVar45,auVar64);
  auVar34 = vunpcklps_avx(auVar53,auVar67);
  auVar45 = vunpckhps_avx(auVar53,auVar67);
  auVar83 = vunpcklps_avx(auVar33,auVar34);
  auVar33 = vunpckhps_avx(auVar33,auVar34);
  auVar11 = vunpcklps_avx(auVar69,auVar45);
  auVar69 = vunpckhps_avx(auVar69,auVar45);
  auVar80 = vunpcklps_avx(auVar71,auVar79);
  auVar45 = vunpckhps_avx(auVar71,auVar79);
  auVar53 = vunpcklps_avx(auVar77,auVar82);
  auVar34 = vunpckhps_avx(auVar77,auVar82);
  auVar12 = vunpcklps_avx(auVar80,auVar53);
  auVar80 = vunpckhps_avx(auVar80,auVar53);
  auVar64 = vunpcklps_avx(auVar45,auVar34);
  auVar53 = vunpckhps_avx(auVar45,auVar34);
  auVar32 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar9 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar1 = auVar32._0_4_;
  fVar7 = auVar32._4_4_;
  fVar44 = auVar32._8_4_;
  fVar8 = auVar32._12_4_;
  fVar42 = auVar9._0_4_;
  fVar43 = auVar9._4_4_;
  fVar35 = auVar9._8_4_;
  fVar36 = auVar9._12_4_;
  auVar68._0_4_ = auVar12._0_4_ * fVar1 + fVar42 * auVar83._0_4_;
  auVar68._4_4_ = auVar12._4_4_ * fVar7 + fVar43 * auVar83._4_4_;
  auVar68._8_4_ = auVar12._8_4_ * fVar44 + fVar35 * auVar83._8_4_;
  auVar68._12_4_ = auVar12._12_4_ * fVar8 + fVar36 * auVar83._12_4_;
  auVar68._16_4_ = auVar12._16_4_ * fVar1 + fVar42 * auVar83._16_4_;
  auVar68._20_4_ = auVar12._20_4_ * fVar7 + fVar43 * auVar83._20_4_;
  auVar68._24_4_ = auVar12._24_4_ * fVar44 + fVar35 * auVar83._24_4_;
  auVar68._28_4_ = auVar12._28_4_ + auVar83._28_4_;
  auVar54._0_4_ = fVar42 * auVar33._0_4_ + fVar1 * auVar80._0_4_;
  auVar54._4_4_ = fVar43 * auVar33._4_4_ + fVar7 * auVar80._4_4_;
  auVar54._8_4_ = fVar35 * auVar33._8_4_ + fVar44 * auVar80._8_4_;
  auVar54._12_4_ = fVar36 * auVar33._12_4_ + fVar8 * auVar80._12_4_;
  auVar54._16_4_ = fVar42 * auVar33._16_4_ + fVar1 * auVar80._16_4_;
  auVar54._20_4_ = fVar43 * auVar33._20_4_ + fVar7 * auVar80._20_4_;
  auVar54._24_4_ = fVar35 * auVar33._24_4_ + fVar44 * auVar80._24_4_;
  auVar54._28_4_ = auVar33._28_4_ + auVar80._28_4_;
  auVar65._0_4_ = auVar64._0_4_ * fVar1 + fVar42 * auVar11._0_4_;
  auVar65._4_4_ = auVar64._4_4_ * fVar7 + fVar43 * auVar11._4_4_;
  auVar65._8_4_ = auVar64._8_4_ * fVar44 + fVar35 * auVar11._8_4_;
  auVar65._12_4_ = auVar64._12_4_ * fVar8 + fVar36 * auVar11._12_4_;
  auVar65._16_4_ = auVar64._16_4_ * fVar1 + fVar42 * auVar11._16_4_;
  auVar65._20_4_ = auVar64._20_4_ * fVar7 + fVar43 * auVar11._20_4_;
  auVar65._24_4_ = auVar64._24_4_ * fVar44 + fVar35 * auVar11._24_4_;
  auVar65._28_4_ = auVar64._28_4_ + auVar33._28_4_;
  fVar37 = fVar42 * auVar69._0_4_ + fVar1 * auVar53._0_4_;
  fVar39 = fVar43 * auVar69._4_4_ + fVar7 * auVar53._4_4_;
  fVar40 = fVar35 * auVar69._8_4_ + fVar44 * auVar53._8_4_;
  fVar41 = fVar36 * auVar69._12_4_ + fVar8 * auVar53._12_4_;
  fVar42 = fVar42 * auVar69._16_4_ + fVar1 * auVar53._16_4_;
  fVar43 = fVar43 * auVar69._20_4_ + fVar7 * auVar53._20_4_;
  fVar44 = fVar35 * auVar69._24_4_ + fVar44 * auVar53._24_4_;
  local_210 = vshufps_avx(ZEXT416(uVar27),ZEXT416(uVar27),0);
  local_220 = local_210;
  auVar32 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->dir).field_0 + 8),
                         *(undefined1 (*) [16])((long)&(ray->org).field_0 + 8),8);
  auVar32 = vdpps_avx(auVar32,auVar32,0x7f);
  auVar9 = vrcpss_avx(auVar32,auVar32);
  auVar32 = ZEXT416((uint)(auVar9._0_4_ * (2.0 - auVar32._0_4_ * auVar9._0_4_)));
  auVar9 = vshufps_avx(auVar32,auVar32,0);
  uVar30 = *(undefined4 *)&(ray->org).field_0;
  auVar72._4_4_ = uVar30;
  auVar72._0_4_ = uVar30;
  auVar72._8_4_ = uVar30;
  auVar72._12_4_ = uVar30;
  auVar72._16_4_ = uVar30;
  auVar72._20_4_ = uVar30;
  auVar72._24_4_ = uVar30;
  auVar72._28_4_ = uVar30;
  auVar45 = vsubps_avx(auVar68,auVar72);
  uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar33._4_4_ = uVar30;
  auVar33._0_4_ = uVar30;
  auVar33._8_4_ = uVar30;
  auVar33._12_4_ = uVar30;
  auVar33._16_4_ = uVar30;
  auVar33._20_4_ = uVar30;
  auVar33._24_4_ = uVar30;
  auVar33._28_4_ = uVar30;
  auVar33 = vsubps_avx(auVar54,auVar33);
  uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar34._4_4_ = uVar30;
  auVar34._0_4_ = uVar30;
  auVar34._8_4_ = uVar30;
  auVar34._12_4_ = uVar30;
  auVar34._16_4_ = uVar30;
  auVar34._20_4_ = uVar30;
  auVar34._24_4_ = uVar30;
  auVar34._28_4_ = uVar30;
  auVar34 = vsubps_avx(auVar65,auVar34);
  fVar1 = (ray->dir).field_0.m128[0];
  auVar86 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar7 = (ray->dir).field_0.m128[1];
  auVar89 = ZEXT3264(CONCAT428(fVar7,CONCAT424(fVar7,CONCAT420(fVar7,CONCAT416(fVar7,CONCAT412(fVar7
                                                  ,CONCAT48(fVar7,CONCAT44(fVar7,fVar7))))))));
  auVar69._0_16_ = *(undefined1 (*) [16])&ray->dir;
  auVar69._16_4_ = ray->tfar;
  auVar69._20_4_ = ray->mask;
  auVar69._24_4_ = ray->id;
  auVar69._28_4_ = ray->flags;
  auVar32 = vshufps_avx(auVar69._0_16_,auVar69._0_16_,0xaa);
  auVar92 = ZEXT3264(CONCAT1616(auVar32,auVar32));
  fVar90 = auVar32._0_4_;
  fVar93 = auVar32._4_4_;
  fVar94 = auVar32._8_4_;
  fVar95 = auVar32._12_4_;
  fVar62 = fVar8 + fVar8 + 0.0;
  fVar35 = auVar9._0_4_;
  fVar52 = fVar35 * (fVar1 * auVar45._0_4_ + fVar7 * auVar33._0_4_ + fVar90 * auVar34._0_4_);
  fVar49 = auVar9._4_4_;
  fVar56 = fVar49 * (fVar1 * auVar45._4_4_ + fVar7 * auVar33._4_4_ + fVar93 * auVar34._4_4_);
  auVar10._4_4_ = fVar56;
  auVar10._0_4_ = fVar52;
  fVar50 = auVar9._8_4_;
  fVar57 = fVar50 * (fVar1 * auVar45._8_4_ + fVar7 * auVar33._8_4_ + fVar94 * auVar34._8_4_);
  auVar10._8_4_ = fVar57;
  fVar58 = auVar9._12_4_ *
           (fVar1 * auVar45._12_4_ + fVar7 * auVar33._12_4_ + fVar95 * auVar34._12_4_);
  auVar10._12_4_ = fVar58;
  fVar59 = fVar35 * (fVar1 * auVar45._16_4_ + fVar7 * auVar33._16_4_ + fVar90 * auVar34._16_4_);
  auVar10._16_4_ = fVar59;
  fVar60 = fVar49 * (fVar1 * auVar45._20_4_ + fVar7 * auVar33._20_4_ + fVar93 * auVar34._20_4_);
  auVar10._20_4_ = fVar60;
  fVar61 = fVar50 * (fVar1 * auVar45._24_4_ + fVar7 * auVar33._24_4_ + fVar94 * auVar34._24_4_);
  auVar10._24_4_ = fVar61;
  auVar10._28_4_ = fVar62;
  auVar80._4_4_ = fVar1 * fVar56;
  auVar80._0_4_ = fVar1 * fVar52;
  auVar80._8_4_ = fVar1 * fVar57;
  auVar80._12_4_ = fVar1 * fVar58;
  auVar80._16_4_ = fVar1 * fVar59;
  auVar80._20_4_ = fVar1 * fVar60;
  auVar80._24_4_ = fVar1 * fVar61;
  auVar80._28_4_ = fVar8;
  auVar83._4_4_ = fVar7 * fVar56;
  auVar83._0_4_ = fVar7 * fVar52;
  auVar83._8_4_ = fVar7 * fVar57;
  auVar83._12_4_ = fVar7 * fVar58;
  auVar83._16_4_ = fVar7 * fVar59;
  auVar83._20_4_ = fVar7 * fVar60;
  auVar83._24_4_ = fVar7 * fVar61;
  auVar83._28_4_ = auVar64._28_4_;
  auVar11._4_4_ = fVar93 * fVar56;
  auVar11._0_4_ = fVar90 * fVar52;
  auVar11._8_4_ = fVar94 * fVar57;
  auVar11._12_4_ = fVar95 * fVar58;
  auVar11._16_4_ = fVar90 * fVar59;
  auVar11._20_4_ = fVar93 * fVar60;
  auVar11._24_4_ = fVar94 * fVar61;
  auVar11._28_4_ = auVar12._28_4_;
  auVar80 = vsubps_avx(auVar45,auVar80);
  auVar96 = ZEXT3264(auVar80);
  auVar83 = vsubps_avx(auVar33,auVar83);
  auVar81 = ZEXT3264(auVar83);
  auVar11 = vsubps_avx(auVar34,auVar11);
  auVar84 = ZEXT3264(auVar11);
  auVar66._0_4_ =
       auVar80._0_4_ * auVar80._0_4_ + auVar83._0_4_ * auVar83._0_4_ + auVar11._0_4_ * auVar11._0_4_
  ;
  auVar66._4_4_ =
       auVar80._4_4_ * auVar80._4_4_ + auVar83._4_4_ * auVar83._4_4_ + auVar11._4_4_ * auVar11._4_4_
  ;
  auVar66._8_4_ =
       auVar80._8_4_ * auVar80._8_4_ + auVar83._8_4_ * auVar83._8_4_ + auVar11._8_4_ * auVar11._8_4_
  ;
  auVar66._12_4_ =
       auVar80._12_4_ * auVar80._12_4_ +
       auVar83._12_4_ * auVar83._12_4_ + auVar11._12_4_ * auVar11._12_4_;
  auVar66._16_4_ =
       auVar80._16_4_ * auVar80._16_4_ +
       auVar83._16_4_ * auVar83._16_4_ + auVar11._16_4_ * auVar11._16_4_;
  auVar66._20_4_ =
       auVar80._20_4_ * auVar80._20_4_ +
       auVar83._20_4_ * auVar83._20_4_ + auVar11._20_4_ * auVar11._20_4_;
  auVar66._24_4_ =
       auVar80._24_4_ * auVar80._24_4_ +
       auVar83._24_4_ * auVar83._24_4_ + auVar11._24_4_ * auVar11._24_4_;
  auVar66._28_4_ = auVar45._28_4_ + auVar45._28_4_ + auVar34._28_4_;
  auVar12._4_4_ = fVar39 * fVar39;
  auVar12._0_4_ = fVar37 * fVar37;
  auVar12._8_4_ = fVar40 * fVar40;
  auVar12._12_4_ = fVar41 * fVar41;
  auVar12._16_4_ = fVar42 * fVar42;
  auVar12._20_4_ = fVar43 * fVar43;
  auVar12._24_4_ = fVar44 * fVar44;
  auVar12._28_4_ = fVar36 + auVar53._28_4_;
  auVar45 = vcmpps_avx(auVar66,auVar12,2);
  auVar32 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar73._16_16_ = auVar32;
  auVar73._0_16_ = auVar32;
  auVar33 = vcvtdq2ps_avx(auVar73);
  auVar33 = vcmpps_avx(_DAT_01f7b060,auVar33,1);
  auVar34 = auVar33 & auVar45;
  if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0x7f,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar34 >> 0xbf,0) != '\0') ||
      (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0') {
    auVar45 = vandps_avx(auVar45,auVar33);
    auVar33 = vsubps_avx(auVar12,auVar66);
    auVar13._4_4_ = fVar49 * auVar33._4_4_;
    auVar13._0_4_ = fVar35 * auVar33._0_4_;
    auVar13._8_4_ = fVar50 * auVar33._8_4_;
    auVar13._12_4_ = auVar9._12_4_ * auVar33._12_4_;
    auVar13._16_4_ = fVar35 * auVar33._16_4_;
    auVar13._20_4_ = fVar49 * auVar33._20_4_;
    auVar13._24_4_ = fVar50 * auVar33._24_4_;
    auVar13._28_4_ = auVar33._28_4_;
    auVar64 = vsqrtps_avx(auVar13);
    auVar78 = ZEXT3264(auVar64);
    auVar10 = vsubps_avx(auVar10,auVar64);
    auVar74._0_4_ = fVar52 + auVar64._0_4_;
    auVar74._4_4_ = fVar56 + auVar64._4_4_;
    auVar74._8_4_ = fVar57 + auVar64._8_4_;
    auVar74._12_4_ = fVar58 + auVar64._12_4_;
    auVar74._16_4_ = fVar59 + auVar64._16_4_;
    auVar74._20_4_ = fVar60 + auVar64._20_4_;
    auVar74._24_4_ = fVar61 + auVar64._24_4_;
    auVar74._28_4_ = fVar62 + auVar64._28_4_;
    auVar75 = ZEXT3264(auVar74);
    auVar32 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar32 = vshufps_avx(auVar32,auVar32,0);
    auVar46._16_16_ = auVar32;
    auVar46._0_16_ = auVar32;
    auVar33 = vcmpps_avx(auVar46,auVar10,2);
    auVar69 = vperm2f128_avx(auVar69,auVar69,0x11);
    auVar12 = vshufps_avx(auVar69,auVar69,0);
    auVar53 = vcmpps_avx(auVar10,auVar12,2);
    auVar69 = vandps_avx(auVar53,auVar33);
    auVar33 = vandps_avx(auVar69,auVar45);
    auVar87 = ZEXT3264(auVar33);
    auVar34 = vcmpps_avx(auVar46,auVar74,2);
    auVar12 = vcmpps_avx(auVar74,auVar12,2);
    auVar34 = vandps_avx(auVar12,auVar34);
    auVar45 = vandps_avx(auVar34,auVar45);
    auVar70 = ZEXT3264(auVar45);
    auVar45 = vorps_avx(auVar33,auVar45);
    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar45 >> 0x7f,0) != '\0') ||
          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0xbf,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0')
    {
      auVar47._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
      auVar47._8_4_ = -auVar64._8_4_;
      auVar47._12_4_ = -auVar64._12_4_;
      auVar47._16_4_ = -auVar64._16_4_;
      auVar47._20_4_ = -auVar64._20_4_;
      auVar47._24_4_ = -auVar64._24_4_;
      auVar47._28_4_ = -auVar64._28_4_;
      local_200 = vblendvps_avx(auVar74,auVar10,auVar33);
      auVar33 = vblendvps_avx(auVar64,auVar47,auVar33);
      fVar44 = auVar33._0_4_;
      fVar8 = auVar33._4_4_;
      auVar14._4_4_ = fVar1 * fVar8;
      auVar14._0_4_ = fVar1 * fVar44;
      fVar42 = auVar33._8_4_;
      auVar14._8_4_ = fVar1 * fVar42;
      fVar43 = auVar33._12_4_;
      auVar14._12_4_ = fVar1 * fVar43;
      fVar35 = auVar33._16_4_;
      auVar14._16_4_ = fVar1 * fVar35;
      fVar36 = auVar33._20_4_;
      auVar14._20_4_ = fVar1 * fVar36;
      fVar37 = auVar33._24_4_;
      auVar14._24_4_ = fVar1 * fVar37;
      auVar14._28_4_ = auVar69._28_4_;
      auVar15._4_4_ = fVar7 * fVar8;
      auVar15._0_4_ = fVar7 * fVar44;
      auVar15._8_4_ = fVar7 * fVar42;
      auVar15._12_4_ = fVar7 * fVar43;
      auVar15._16_4_ = fVar7 * fVar35;
      auVar15._20_4_ = fVar7 * fVar36;
      auVar15._24_4_ = fVar7 * fVar37;
      auVar15._28_4_ = auVar53._28_4_;
      auVar16._4_4_ = fVar93 * fVar8;
      auVar16._0_4_ = fVar90 * fVar44;
      auVar16._8_4_ = fVar94 * fVar42;
      auVar16._12_4_ = fVar95 * fVar43;
      auVar16._16_4_ = fVar90 * fVar35;
      auVar16._20_4_ = fVar93 * fVar36;
      auVar16._24_4_ = fVar94 * fVar37;
      auVar16._28_4_ = auVar33._28_4_;
      local_1e0 = vsubps_avx(auVar14,auVar80);
      auVar55 = ZEXT3264(local_1e0);
      local_1c0 = vsubps_avx(auVar15,auVar83);
      local_1a0 = vsubps_avx(auVar16,auVar11);
      auVar48 = ZEXT3264(local_1a0);
      uVar27 = vmovmskps_avx(auVar45);
      uVar29 = (ulong)uVar27;
      local_2c0 = context;
      local_2b8 = pSVar19;
      local_2b0 = sphere;
      do {
        local_270.hit = (RTCHitN *)&local_2a0;
        local_270.valid = &local_2c4;
        auVar91 = auVar92._0_28_;
        auVar63 = auVar55._28_36_;
        auVar88 = auVar89._0_28_;
        auVar51 = auVar48._28_36_;
        auVar85 = auVar86._0_28_;
        auVar76 = auVar78._0_28_;
        uVar20 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        local_288 = *(uint *)(local_220 + uVar20 * 4);
        pGVar2 = (pSVar19->geometries).items[local_288].ptr;
        local_270.ray = (RTCRayN *)ray;
        if ((pGVar2->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar25 = true, auVar69 = auVar70._0_32_, auVar45 = auVar87._0_32_,
             auVar33 = auVar75._0_32_, auVar34 = auVar96._0_32_, auVar80 = auVar81._0_32_,
             auVar83 = auVar84._0_32_, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00a6fa3c;
          local_180 = auVar70._0_32_;
          local_160 = auVar87._0_32_;
          local_140 = auVar78._0_32_;
          local_120 = auVar75._0_32_;
          local_100 = auVar84._0_32_;
          local_e0 = auVar81._0_32_;
          local_c0 = auVar96._0_32_;
          local_a0 = auVar92._0_32_;
          local_80 = auVar89._0_32_;
          local_240 = auVar86._0_32_;
          local_28c = (local_2b0->primIDs).field_0.i[uVar20];
          local_2a0 = *(undefined4 *)(local_1e0 + uVar20 * 4);
          local_29c = *(undefined4 *)(local_1c0 + uVar20 * 4);
          local_298 = *(uint *)(local_1a0 + uVar20 * 4);
          auVar48 = ZEXT464(local_298);
          local_294 = 0;
          local_284 = context->user->instID[0];
          local_280 = context->user->instPrimID[0];
          local_2a4 = ray->tfar;
          ray->tfar = *(float *)(local_200 + uVar20 * 4);
          local_2c4 = -1;
          local_270.geometryUserPtr = pGVar2->userPtr;
          local_270.context = context->user;
          local_270.N = 1;
          if (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a6f970:
            auVar63 = auVar55._28_36_;
            auVar51 = auVar48._28_36_;
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
              auVar48 = ZEXT1664(auVar48._0_16_);
              auVar55 = ZEXT1664(auVar55._0_16_);
              (*p_Var6)(&local_270);
              auVar63 = auVar55._28_36_;
              auVar51 = auVar48._28_36_;
              context = local_2c0;
              if (*local_270.valid == 0) goto LAB_00a6f9b1;
            }
            bVar25 = true;
            auVar85 = local_240._0_28_;
            auVar88 = local_80._0_28_;
            auVar91 = local_a0._0_28_;
            auVar76 = local_140._0_28_;
            auVar69 = local_180;
            auVar45 = local_160;
            auVar33 = local_120;
            auVar34 = local_c0;
            auVar80 = local_e0;
            auVar83 = local_100;
            goto LAB_00a6fa3c;
          }
          auVar48 = ZEXT464(local_298);
          auVar55 = ZEXT1664(auVar55._0_16_);
          (*pGVar2->occlusionFilterN)(&local_270);
          context = local_2c0;
          if (*local_270.valid != 0) goto LAB_00a6f970;
LAB_00a6f9b1:
          ray->tfar = local_2a4;
          auVar86 = ZEXT3264(local_240);
          auVar89 = ZEXT3264(local_80);
          auVar92 = ZEXT3264(local_a0);
          auVar96 = ZEXT3264(local_c0);
          auVar81 = ZEXT3264(local_e0);
          auVar84 = ZEXT3264(local_100);
          auVar75 = ZEXT3264(local_120);
          auVar78 = ZEXT3264(local_140);
          auVar87 = ZEXT3264(local_160);
          auVar70 = ZEXT3264(local_180);
          pSVar19 = local_2b8;
          context = local_2c0;
        }
        auVar91 = auVar92._0_28_;
        auVar63 = auVar55._28_36_;
        auVar88 = auVar89._0_28_;
        auVar51 = auVar48._28_36_;
        auVar85 = auVar86._0_28_;
        auVar76 = auVar78._0_28_;
        uVar29 = uVar29 ^ 1L << (uVar20 & 0x3f);
      } while (uVar29 != 0);
      bVar25 = false;
      auVar69 = auVar70._0_32_;
      auVar45 = auVar87._0_32_;
      auVar33 = auVar75._0_32_;
      auVar34 = auVar96._0_32_;
      auVar80 = auVar81._0_32_;
      auVar83 = auVar84._0_32_;
LAB_00a6fa3c:
      auVar69 = vandps_avx(auVar45,auVar69);
      fVar1 = ray->tfar;
      auVar38._4_4_ = fVar1;
      auVar38._0_4_ = fVar1;
      auVar38._8_4_ = fVar1;
      auVar38._12_4_ = fVar1;
      auVar38._16_4_ = fVar1;
      auVar38._20_4_ = fVar1;
      auVar38._24_4_ = fVar1;
      auVar38._28_4_ = fVar1;
      auVar45 = vcmpps_avx(auVar33,auVar38,2);
      auVar11 = auVar69 & auVar45;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      {
        return bVar25;
      }
      auVar69 = vandps_avx(auVar45,auVar69);
      fVar1 = auVar76._0_4_;
      fVar7 = auVar76._4_4_;
      auVar17._4_4_ = auVar85._4_4_ * fVar7;
      auVar17._0_4_ = auVar85._0_4_ * fVar1;
      fVar44 = auVar76._8_4_;
      auVar17._8_4_ = auVar85._8_4_ * fVar44;
      fVar8 = auVar76._12_4_;
      auVar17._12_4_ = auVar85._12_4_ * fVar8;
      fVar42 = auVar76._16_4_;
      auVar17._16_4_ = auVar85._16_4_ * fVar42;
      fVar43 = auVar76._20_4_;
      auVar17._20_4_ = auVar85._20_4_ * fVar43;
      fVar35 = auVar76._24_4_;
      auVar17._24_4_ = auVar85._24_4_ * fVar35;
      auVar17._28_4_ = auVar45._28_4_;
      auVar81._0_4_ = auVar88._0_4_ * fVar1;
      auVar81._4_4_ = auVar88._4_4_ * fVar7;
      auVar81._8_4_ = auVar88._8_4_ * fVar44;
      auVar81._12_4_ = auVar88._12_4_ * fVar8;
      auVar81._16_4_ = auVar88._16_4_ * fVar42;
      auVar81._20_4_ = auVar88._20_4_ * fVar43;
      auVar81._24_4_ = auVar88._24_4_ * fVar35;
      auVar81._28_36_ = auVar51;
      auVar84._0_4_ = auVar91._0_4_ * fVar1;
      auVar84._4_4_ = auVar91._4_4_ * fVar7;
      auVar84._8_4_ = auVar91._8_4_ * fVar44;
      auVar84._12_4_ = auVar91._12_4_ * fVar8;
      auVar84._16_4_ = auVar91._16_4_ * fVar42;
      auVar84._20_4_ = auVar91._20_4_ * fVar43;
      auVar84._24_4_ = auVar91._24_4_ * fVar35;
      auVar84._28_36_ = auVar63;
      local_1e0 = vsubps_avx(auVar17,auVar34);
      local_1c0 = vsubps_avx(auVar81._0_32_,auVar80);
      local_1a0 = vsubps_avx(auVar84._0_32_,auVar83);
      local_200 = auVar33;
      local_2b8 = context->scene;
      uVar30 = vmovmskps_avx(auVar69);
      uVar29 = CONCAT44((int)(uVar20 >> 0x20),uVar30);
      do {
        local_270.hit = (RTCHitN *)&local_2a0;
        local_270.valid = &local_2c4;
        uVar20 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        local_288 = *(uint *)(local_220 + uVar20 * 4);
        pGVar2 = (local_2b8->geometries).items[local_288].ptr;
        if ((pGVar2->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar18 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a6fc2d;
          local_28c = (local_2b0->primIDs).field_0.i[uVar20];
          local_2a0 = *(undefined4 *)(local_1e0 + uVar20 * 4);
          local_29c = *(undefined4 *)(local_1c0 + uVar20 * 4);
          local_298 = *(uint *)(local_1a0 + uVar20 * 4);
          local_294 = 0;
          local_284 = context->user->instID[0];
          local_280 = context->user->instPrimID[0];
          local_240._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_200 + uVar20 * 4);
          local_2c4 = -1;
          local_270.geometryUserPtr = pGVar2->userPtr;
          local_270.context = context->user;
          local_270.N = 1;
          local_270.ray = (RTCRayN *)ray;
          if ((pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar2->occlusionFilterN)(&local_270), context = local_2c0, *local_270.valid != 0))
          {
            p_Var6 = context->args->filter;
            if ((p_Var6 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar2->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var6)(&local_270), *local_270.valid != 0)))) {
              bVar18 = 1;
              goto LAB_00a6fc2d;
            }
          }
          ray->tfar = (float)local_240._0_4_;
          context = local_2c0;
        }
        uVar29 = uVar29 ^ 1L << (uVar20 & 0x3f);
        if (uVar29 == 0) {
          bVar18 = 0;
LAB_00a6fc2d:
          return (bool)(bVar25 | bVar18);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time());
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }